

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_test_overlap(int ndim,long *tfpixel,long *tlpixel,long *fpixel,long *lpixel,long *ininc,
                       int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long local_a0 [6];
  long alStack_70 [2];
  long tiledim [6];
  long imgdim [6];
  ulong uVar9;
  
  uVar7 = (ulong)(uint)*status;
  if (*status < 1) {
    if (0 < ndim) {
      uVar9 = 0;
      uVar8 = 0;
      uVar11 = 0;
      do {
        lVar5 = tlpixel[uVar11];
        lVar1 = fpixel[uVar11];
        uVar7 = uVar9;
        if (lVar5 < lVar1) goto LAB_00190502;
        lVar2 = tfpixel[uVar11];
        if (lpixel[uVar11] < lVar2) goto LAB_00190502;
        lVar3 = ininc[uVar11];
        lVar10 = -lVar3;
        if (0 < lVar3) {
          lVar10 = lVar3;
        }
        lVar4 = (lpixel[uVar11] - lVar1) / lVar10;
        lVar3 = lVar4 + 1;
        tiledim[uVar11 - 1] = lVar3;
        if (lVar4 < 0) {
LAB_0019064a:
          *status = 0x143;
          uVar7 = uVar8;
          goto LAB_00190502;
        }
        lVar4 = (lVar5 - lVar2) + 1;
        local_a0[uVar11 + 1] = lVar4;
        if (lVar5 - lVar2 < 0) goto LAB_0019064a;
        if (uVar11 != 0) {
          local_a0[uVar11 + 1] = lVar4 * local_a0[uVar11];
        }
        lVar4 = lVar2;
        while ((lVar4 + -lVar1) % lVar10 != 0) {
          lVar12 = lVar4 + -1;
          lVar4 = lVar4 + 1;
          if (lVar5 + -1 <= lVar12) goto LAB_00190502;
        }
        while ((lVar5 + -lVar1) % lVar10 != 0) {
          lVar5 = lVar5 + -1;
          uVar7 = uVar8;
          if (lVar5 <= lVar4 + -1) goto LAB_00190502;
        }
        uVar6 = lVar1 - lVar2;
        if (lVar1 - lVar2 < 1) {
          uVar6 = uVar9;
        }
        while ((long)((lVar2 - lVar1) + uVar6) % lVar10 != 0) {
          uVar6 = uVar6 + 1;
          uVar7 = uVar8;
          if (local_a0[uVar11 + 1] <= (long)uVar6) goto LAB_00190502;
        }
        if (uVar11 != 0) {
          tiledim[uVar11 - 1] = lVar3 * alStack_70[uVar11];
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uint)ndim);
    }
    uVar7 = 1;
  }
LAB_00190502:
  return (int)uVar7;
}

Assistant:

int imcomp_test_overlap (
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    long *ininc,        /* I - increment to be applied in each image dimen. */
    int *status)

/* 
  test if there are any intersecting pixels between this tile and the section
  of the image defined by fixel, lpixel, ininc. 
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    int ii;
    long tf, tl;

    if (*status > 0)
        return(*status);


    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(0);  /* there are no overlapping pixels */

        inc[ii] = ininc[ii];

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(0);  /* no overlapping pixels */
        }

        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    return(1);  /* there appears to be  intersecting pixels */
}